

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

int disp_nifti1_extension(char *mesg,nifti1_extension *ext,int maxlen)

{
  uint uVar1;
  uint uVar2;
  size_t __size;
  char *__ptr;
  
  if (mesg != (char *)0x0) {
    fputs(mesg,_stdout);
  }
  if (ext == (nifti1_extension *)0x0) {
    disp_nifti1_extension_cold_1();
    return 1;
  }
  fprintf(_stdout,"ecode = %d, esize = %d, edata = ",(ulong)(uint)ext->ecode,(ulong)(uint)ext->esize
         );
  if (ext->edata == (char *)0x0) {
    __ptr = "(NULL)\n";
    __size = 7;
  }
  else {
    if ((ext->ecode | 2U) == 6) {
      uVar2 = ext->esize - 8;
      uVar1 = maxlen;
      if ((int)uVar2 < maxlen) {
        uVar1 = uVar2;
      }
      if (maxlen < 0) {
        uVar1 = uVar2;
      }
      fprintf(_stdout,"%.*s\n",(ulong)uVar1);
      goto LAB_0010ccf5;
    }
    __ptr = "(unknown data type)\n";
    __size = 0x14;
  }
  fwrite(__ptr,__size,1,_stdout);
LAB_0010ccf5:
  fflush(_stdout);
  return 0;
}

Assistant:

int disp_nifti1_extension(char *mesg, nifti1_extension * ext, int maxlen)
{
   int len;
   if( mesg ) fputs(mesg, stdout);

   if( !ext )
   {
      fprintf(stderr,"** no extension to display\n");
      return 1;
   }

   fprintf(stdout,"ecode = %d, esize = %d, edata = ",
           ext->ecode, ext->esize);

   if( !ext->edata )
      fprintf(stdout,"(NULL)\n");
   else if ( ext->ecode == NIFTI_ECODE_AFNI ||
             ext->ecode == NIFTI_ECODE_COMMENT )
   {
      len = ext->esize-8;
      if( maxlen >= 0 && len > maxlen ) len = maxlen;
      fprintf(stdout,"%.*s\n", len, (char *)ext->edata);
   }
   else
      fprintf(stdout,"(unknown data type)\n");

   fflush(stdout);

   return 0;
}